

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

int smf_track_add_eot_pulses(smf_track_t *track,int pulses)

{
  smf_event_t *psVar1;
  smf_event_t *last_event;
  smf_event_t *event;
  int pulses_local;
  smf_track_t *track_local;
  
  psVar1 = smf_track_get_last_event(track);
  if ((psVar1 == (smf_event_t *)0x0) || (psVar1->time_pulses <= pulses)) {
    psVar1 = smf_event_new_from_bytes(0xff,0x2f,0);
    if (psVar1 == (smf_event_t *)0x0) {
      track_local._4_4_ = -3;
    }
    else {
      smf_track_add_event_pulses(track,psVar1,pulses);
      track_local._4_4_ = 0;
    }
  }
  else {
    track_local._4_4_ = -2;
  }
  return track_local._4_4_;
}

Assistant:

int
smf_track_add_eot_pulses(smf_track_t *track, int pulses)
{
	smf_event_t *event, *last_event;

	last_event = smf_track_get_last_event(track);
	if (last_event != NULL) {
		if (last_event->time_pulses > pulses)
			return (-2);
	}

	event = smf_event_new_from_bytes(0xFF, 0x2F, 0x00);
	if (event == NULL)
		return (-3);

	smf_track_add_event_pulses(track, event, pulses);

	return (0);
}